

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

void __thiscall ArgsManager::ClearPathCache(ArgsManager *this)

{
  AnnotatedMixin<std::recursive_mutex> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff18;
  path *this_00;
  path *in_stack_ffffffffffffff20;
  path *ppVar1;
  path *this_01;
  char *in_stack_ffffffffffffff40;
  AnnotatedMixin<std::recursive_mutex> *mutexIn;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff58;
  path local_68;
  path local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  mutexIn = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_ffffffffffffff18);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff58,mutexIn,&stack0xffffffffffffff58,in_stack_ffffffffffffff40,
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  this_01 = (path *)0x0;
  local_38.super_path._M_pathname.field_2._M_allocated_capacity = 0;
  local_38.super_path._M_pathname.field_2._8_8_ = 0;
  local_38.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_38.super_path._M_pathname._M_string_length = 0;
  local_38.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  this_00 = &local_38;
  fs::path::path(this_00);
  fs::path::operator=(this_01,in_stack_ffffffffffffff20);
  fs::path::~path(this_00);
  local_68.super_path._M_pathname.field_2._8_8_ = 0;
  local_68.super_path._M_pathname._M_string_length = 0;
  local_68.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  ppVar1 = &local_68;
  local_68.super_path._M_pathname._M_dataplus._M_p = (pointer)this_01;
  local_68.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)this_01;
  fs::path::path(this_00);
  fs::path::operator=(this_01,ppVar1);
  fs::path::~path(this_00);
  fs::path::path(this_00);
  fs::path::operator=(this_01,ppVar1);
  fs::path::~path(this_00);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ArgsManager::ClearPathCache()
{
    LOCK(cs_args);

    m_cached_datadir_path = fs::path();
    m_cached_network_datadir_path = fs::path();
    m_cached_blocks_path = fs::path();
}